

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O0

void __thiscall
ON_SubDEdgeIterator::ON_SubDEdgeIterator
          (ON_SubDEdgeIterator *this,ON_SubD *subd,ON_SubDVertex *vertex)

{
  uint edge_count_00;
  ON_SubDEdge *first;
  ON_SubDEdge *last;
  ON_SubDComponentPtr component_ptr;
  ON_SubDRef local_48 [2];
  uint local_24;
  ON_SubDVertex *pOStack_20;
  uint edge_count;
  ON_SubDVertex *vertex_local;
  ON_SubD *subd_local;
  ON_SubDEdgeIterator *this_local;
  
  pOStack_20 = vertex;
  vertex_local = (ON_SubDVertex *)subd;
  subd_local = (ON_SubD *)this;
  ON_SubDRef::ON_SubDRef(&this->m_subd_ref);
  this->m_e_first = (ON_SubDEdge *)0x0;
  this->m_e_last = (ON_SubDEdge *)0x0;
  this->m_e_current = (ON_SubDEdge *)0x0;
  this->m_edge_index = 0;
  this->m_edge_count = 0;
  (this->m_component_ptr).m_ptr = 0;
  local_24 = ON_SubDVertex::EdgeCount(pOStack_20);
  ON_SubDRef::CreateReferenceForExperts(local_48,(ON_SubD *)vertex_local);
  edge_count_00 = local_24;
  first = ON_SubDVertex::Edge(pOStack_20,0);
  last = ON_SubDVertex::Edge(pOStack_20,local_24 - 1);
  component_ptr = ON_SubDComponentPtr::Create(pOStack_20);
  Internal_Init(this,local_48,edge_count_00,first,last,component_ptr);
  ON_SubDRef::~ON_SubDRef(local_48);
  return;
}

Assistant:

ON_SubDEdgeIterator::ON_SubDEdgeIterator(
  const class ON_SubD& subd,
  const class ON_SubDVertex& vertex
  )
{
  const unsigned int edge_count = vertex.EdgeCount();
  Internal_Init(
    ON_SubDRef::CreateReferenceForExperts(subd),
    edge_count,
    vertex.Edge(0),
    vertex.Edge(edge_count - 1),
    ON_SubDComponentPtr::Create(&vertex)
  );
}